

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function>::
insert<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function>::const_iterator>
          (Map<std::__cxx11::string,CoreML::Specification::MILSpec::Function> *this,
          const_iterator first,const_iterator last)

{
  value_type *key;
  Function *this_00;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>::KeyValuePair>
  local_58;
  iterator local_40;
  
  local_58.bucket_index_ = first.it_.bucket_index_;
  local_58.node_ = first.it_.node_;
  local_58.m_ = first.it_.m_;
  while (local_58.node_ != last.it_.node_) {
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::find(&local_40,
           (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
            *)this,&(((local_58.node_)->kv).v_)->first);
    if (local_40.it_.node_ == (Node *)0x0) {
      key = ((local_58.node_)->kv).v_;
      this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
                ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
                              *)this,&key->first);
      CoreML::Specification::MILSpec::Function::CopyFrom(this_00,&key->second);
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>::KeyValuePair>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }